

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O0

void Vec_BitWriteEntry(Vec_Bit_t *p,int i,int Entry)

{
  int iVar1;
  int Entry_local;
  int i_local;
  Vec_Bit_t *p_local;
  
  if ((-1 < i) && (i < p->nSize)) {
    iVar1 = i >> 5;
    if (Entry == 1) {
      p->pArray[iVar1] = 1 << ((byte)i & 0x1f) | p->pArray[iVar1];
    }
    else {
      if (Entry != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x137,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      p->pArray[iVar1] = (1 << ((byte)i & 0x1f) ^ 0xffffffffU) & p->pArray[iVar1];
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
}

Assistant:

static inline void Vec_BitWriteEntry( Vec_Bit_t * p, int i, int Entry )
{
    assert( i >= 0 && i < p->nSize );
    if ( Entry == 1 )
        p->pArray[i >> 5] |=  (1 << (i & 31));
    else if ( Entry == 0 )
        p->pArray[i >> 5] &= ~(1 << (i & 31));
    else assert(0);
}